

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O1

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  void *__s;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *vExists;
  int *piVar7;
  char *pcVar8;
  time_t tVar9;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  Vec_Int_t *p_00;
  int iVar16;
  timespec ts;
  long local_38;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x47,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x48,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x49,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if ((nPars < 1) || (iVar3 = pNtk->vPis->nSize, iVar3 <= nPars)) {
    __assert_fail("nPars > 0 && nPars < Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x4a,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (fDumpCnf != 0) {
    __s = (void *)0x0;
    pAig = Abc_NtkToDar(pNtk,0,0);
    p = Cnf_Derive(pAig,0);
    iVar3 = p->nVars;
    iVar16 = 0x10;
    if (0xe < iVar3 - 1U) {
      iVar16 = iVar3;
    }
    if (iVar16 != 0) {
      __s = malloc((long)iVar16 << 2);
    }
    if (__s != (void *)0x0) {
      memset(__s,0,(long)iVar3 * 4);
    }
    pVVar2 = pAig->vCis;
    if (0 < pVVar2->nSize) {
      uVar14 = 0;
      do {
        if (uVar14 < (uint)nPars) {
          iVar16 = p->pVarNums[*(int *)((long)pVVar2->pArray[uVar14] + 0x24)];
          if (((long)iVar16 < 0) || (iVar3 <= iVar16)) goto LAB_002f4227;
          *(undefined4 *)((long)__s + (long)iVar16 * 4) = 1;
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)pVVar2->nSize);
    }
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    uVar14 = 0x10;
    if (0x10 < (uint)nPars) {
      uVar14 = (ulong)(uint)nPars;
    }
    piVar7 = (int *)0x0;
    pVVar5->nSize = 0;
    pVVar5->nCap = (int)uVar14;
    piVar6 = (int *)malloc(uVar14 << 2);
    pVVar5->pArray = piVar6;
    iVar16 = pNtk->vPis->nSize - nPars;
    vExists = (Vec_Int_t *)malloc(0x10);
    if (iVar16 - 1U < 0xf) {
      iVar16 = 0x10;
    }
    vExists->nSize = 0;
    vExists->nCap = iVar16;
    if (iVar16 != 0) {
      piVar7 = (int *)malloc((long)iVar16 << 2);
    }
    vExists->pArray = piVar7;
    if (0 < iVar3) {
      lVar13 = 0;
      do {
        p_00 = vExists;
        if (*(int *)((long)__s + lVar13 * 4) != 0) {
          p_00 = pVVar5;
        }
        Vec_IntPush(p_00,(int)lVar13);
        lVar13 = lVar13 + 1;
      } while (iVar3 != lVar13);
    }
    pcVar8 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
    Cnf_DataWriteIntoFile(p,pcVar8,0,pVVar5,vExists);
    Aig_ManStop(pAig);
    Cnf_DataFree(p);
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (int *)0x0;
    }
    free(pVVar5);
    if (vExists->pArray != (int *)0x0) {
      free(vExists->pArray);
      vExists->pArray = (int *)0x0;
    }
    free(vExists);
    if (__s != (void *)0x0) {
      free(__s);
    }
    printf("The 2QBF formula was written into file \"%s\".\n",pcVar8);
    return;
  }
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar16 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar16;
  if (iVar16 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar16 << 2);
  }
  pVVar5->pArray = piVar6;
  pVVar5->nSize = iVar3;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0,(long)iVar3 << 2);
  }
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  if (nPars < pNtk->vPis->nSize) {
    uVar14 = (ulong)(uint)nPars;
    do {
      uVar4 = rand();
      if (pVVar5->nSize <= (int)uVar14) {
LAB_002f4227:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar5->pArray[uVar14] = uVar4 & 1;
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < pNtk->vPis->nSize);
  }
  Abc_NtkVectorClearPars(pVVar5,nPars);
  pNtk_00 = Abc_NtkMiterCofactor(pNtk,pVVar5);
  if (fVerbose != 0) {
    printf("Iter %2d : ",0);
    printf("AIG = %6d  ",(ulong)(uint)pNtk_00->nObjCounts[7]);
    Abc_NtkVectorPrintVars(pNtk,pVVar5,nPars);
    putchar(10);
  }
  if (nItersMax < 1) {
    iVar16 = 0;
  }
  else {
    uVar14 = 0;
    do {
      iVar3 = clock_gettime(3,(timespec *)&ts);
      if (iVar3 < 0) {
        local_38 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        local_38 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      iVar3 = Abc_NtkDSat(pNtk_00,0,0,0,0,0,1,0,0,0);
      iVar16 = clock_gettime(3,(timespec *)&ts);
      if (iVar16 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      iVar16 = (int)uVar14;
      if (iVar3 != 0) {
        if (iVar3 != -1) {
          if (iVar3 != 1) goto LAB_002f3ee0;
          goto LAB_002f40bc;
        }
        pcVar8 = "Synthesis timed out.";
LAB_002f40ca:
        puts(pcVar8);
        goto LAB_002f40d9;
      }
      Abc_NtkModelToVector(pNtk_00,pVVar5);
LAB_002f3ee0:
      pVVar2 = pNtk->vPis;
      uVar12 = (ulong)(uint)nPars;
      if (nPars < pVVar2->nSize) {
        do {
          if (pVVar5->nSize <= (int)uVar12) goto LAB_002f4227;
          pVVar5->pArray[uVar12] = -1;
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < pVVar2->nSize);
      }
      pAVar10 = Abc_NtkMiterCofactor(pNtk,pVVar5);
      if (pAVar10->vPos->nSize < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)*pAVar10->vPos->pArray + 0x14);
      *puVar1 = *puVar1 ^ 0x400;
      clock_gettime(3,(timespec *)&ts);
      iVar3 = Abc_NtkMiterSat(pAVar10,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      clock_gettime(3,(timespec *)&ts);
      if (iVar3 == 0) {
        Abc_NtkModelToVector(pAVar10,pVVar5);
      }
      Abc_NtkDelete(pAVar10);
      if (iVar3 == -1) {
        pcVar8 = "Verification timed out.";
        goto LAB_002f40ca;
      }
      if (iVar3 == 1) {
        Abc_NtkDelete(pNtk_00);
        if ((long)pVVar5->nSize < 1) {
          uVar4 = 0;
        }
        else {
          lVar15 = 0;
          uVar4 = 0;
          do {
            uVar4 = uVar4 + (pVVar5->pArray[lVar15] == 0);
            lVar15 = lVar15 + 1;
          } while (pVVar5->nSize != lVar15);
        }
        printf("Parameters: ");
        uVar12 = 0;
        do {
          if ((long)pVVar5->nSize <= (long)uVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("%d",(ulong)(uint)pVVar5->pArray[uVar12]);
          uVar12 = uVar12 + 1;
        } while ((uint)nPars != uVar12);
        printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar4,(ulong)(pVVar5->nSize - uVar4));
        iVar3 = 0x993042;
        printf("Solved after %d iterations.  ",uVar14);
        goto LAB_002f417f;
      }
      Abc_NtkVectorClearPars(pVVar5,nPars);
      pAVar10 = Abc_NtkMiterCofactor(pNtk,pVVar5);
      pAVar11 = Abc_NtkMiterAnd(pNtk_00,pAVar10,0,0);
      Abc_NtkDelete(pAVar10);
      Abc_NtkDelete(pNtk_00);
      if (fVerbose != 0) {
        printf("Iter %2d : ",(ulong)(iVar16 + 1));
        printf("AIG = %6d  ",(ulong)(uint)pAVar11->nObjCounts[7]);
        Abc_NtkVectorPrintVars(pNtk,pVVar5,nPars);
        iVar3 = 0x9a936e;
        printf("  ");
        Abc_Print(iVar3,"%s =","Syn");
        Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar15 + local_38) / 1000000.0);
      }
      uVar14 = (ulong)(iVar16 + 1U);
      pNtk_00 = pAVar11;
    } while (iVar16 + 1U != nItersMax);
    uVar14 = (ulong)(uint)nItersMax;
LAB_002f40bc:
    iVar16 = (int)uVar14;
  }
LAB_002f40d9:
  Abc_NtkDelete(pNtk_00);
  if (iVar16 == nItersMax) {
    iVar3 = 0x993060;
    printf("Quit after %d iterations.  ",(ulong)(uint)nItersMax);
  }
  else {
    iVar3 = 0x99307c;
    printf("Implementation does not exist.  ");
  }
LAB_002f417f:
  Abc_Print(iVar3,"%s =","Total runtime");
  iVar16 = 3;
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar15 + lVar13) / 1000000.0);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  free(pVVar5);
  return;
}

Assistant:

void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d iterations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Quit after %d iterations.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}